

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint Kit_DsdNonDsdSupports(Kit_DsdNtk_t *pNtk)

{
  Kit_DsdObj_t KVar1;
  int Lit;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  Kit_DsdGetSupports(pNtk);
  uVar3 = 0;
  for (uVar4 = 0; (uVar4 < pNtk->nNodes && (pNtk->pNodes[uVar4] != (Kit_DsdObj_t *)0x0));
      uVar4 = uVar4 + 1) {
    KVar1 = *pNtk->pNodes[uVar4];
    if (((uint)KVar1 & 0x1c0) == 0x140) {
      Lit = Abc_Var2Lit((uint)KVar1 & 0x3f,0);
      uVar2 = Kit_DsdLitSupport(pNtk,Lit);
      uVar3 = uVar3 | uVar2;
    }
  }
  return uVar3;
}

Assistant:

unsigned Kit_DsdNonDsdSupports( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i, uSupport = 0;
//    ABC_FREE( pNtk->pSupps );
    Kit_DsdGetSupports( pNtk );
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        uSupport |= Kit_DsdLitSupport( pNtk, Abc_Var2Lit(pObj->Id,0) );
    }
    return uSupport;
}